

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc.c
# Opt level: O3

bool is_editing(CHAR_DATA *ch)

{
  return ch->desc->editor - 1U < 4;
}

Assistant:

bool is_editing(CHAR_DATA *ch)
{
	switch (ch->desc->editor)
	{
		case ED_AREA:
		case ED_ROOM:
		case ED_OBJECT:
		case ED_MOBILE:
			return true;
		default:
			return false;
	}

	return false;
}